

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O3

void __thiscall
test::syntax_tests::iu_TypedPrintToTest_x_iutest_x_Print_Test<unsigned_short>::Body
          (iu_TypedPrintToTest_x_iutest_x_Print_Test<unsigned_short> *this)

{
  pointer pcVar1;
  TypeParam_conflict5 d;
  iu_global_format_stringstream strm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  undefined1 local_328 [32];
  char *local_308;
  undefined8 local_300;
  ios_base local_2a8 [264];
  undefined1 local_1a0 [392];
  
  memset((iu_global_format_stringstream *)local_1a0,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a0);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_328);
  pcVar1 = local_328 + 0x10;
  std::ostream::_M_insert<unsigned_long>((ulong)pcVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_328);
  std::ios_base::~ios_base(local_2a8);
  iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a0,&local_348);
  local_328._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"Succeeded.\n","");
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp";
  local_300 = 0x3db;
  iutest::AssertionHelper::OnFixed((AssertionHelper *)local_328,(Fixed *)local_1a0,false);
  if ((pointer)local_328._0_8_ != pcVar1) {
    operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
  memset((iu_global_format_stringstream *)local_1a0,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a0);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_328);
  pcVar1 = local_328 + 0x10;
  std::ostream::_M_insert<unsigned_long>((ulong)pcVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_328);
  std::ios_base::~ios_base(local_2a8);
  iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a0,&local_368);
  local_328._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"Succeeded.\n","");
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp";
  local_300 = 0x3dc;
  iutest::AssertionHelper::OnFixed((AssertionHelper *)local_328,(Fixed *)local_1a0,false);
  if ((pointer)local_328._0_8_ != pcVar1) {
    operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
  memset((iu_global_format_stringstream *)local_1a0,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a0);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_328);
  pcVar1 = local_328 + 0x10;
  std::ostream::_M_insert<unsigned_long>((ulong)pcVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_328);
  std::ios_base::~ios_base(local_2a8);
  iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a0,&local_388);
  local_328._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"Succeeded.\n","");
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp";
  local_300 = 0x3dd;
  iutest::AssertionHelper::OnFixed((AssertionHelper *)local_328,(Fixed *)local_1a0,false);
  if ((pointer)local_328._0_8_ != pcVar1) {
    operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
  memset((iu_global_format_stringstream *)local_1a0,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a0);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_328);
  pcVar1 = local_328 + 0x10;
  std::ostream::_M_insert<unsigned_long>((ulong)pcVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_328);
  std::ios_base::~ios_base(local_2a8);
  iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a0,&local_3a8);
  local_328._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"Succeeded.\n","");
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp";
  local_300 = 0x3de;
  iutest::AssertionHelper::OnFixed((AssertionHelper *)local_328,(Fixed *)local_1a0,false);
  if ((pointer)local_328._0_8_ != pcVar1) {
    operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
  return;
}

Assistant:

IUTEST_TYPED_TEST(TypedPrintToTest, Print)
{
    TypeParam a = 0;
    TypeParam& b = a;
    const TypeParam c = a;
    const volatile TypeParam d = a;

    IUTEST_SUCCEED() << ::iutest::PrintToString(a);
    IUTEST_SUCCEED() << ::iutest::PrintToString(b);
    IUTEST_SUCCEED() << ::iutest::PrintToString(c);
    IUTEST_SUCCEED() << ::iutest::PrintToString(d);
}